

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O2

void __thiscall customCountUnits_testAllInv_Test::TestBody(customCountUnits_testAllInv_Test *this)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  char *in_R9;
  ushort code;
  AssertHelper local_a0;
  AssertionResult gtest_ar__6;
  precise_unit cunit3;
  precise_unit cunit2;
  AssertHelper local_68;
  unit_data local_60;
  undefined4 uStack_5c;
  precise_unit cunit1;
  
  for (code = 0; code != 0x10; code = code + 1) {
    cunit1 = units::precise::generate_custom_count_unit(code);
    local_60 = cunit1.base_units_;
    bVar2 = units::precise::custom::is_custom_count_unit(&local_60);
    cunit2.multiplier_._0_1_ = bVar2;
    cunit2.base_units_ = (unit_data)0x0;
    cunit2.commodity_ = 0;
    if (!bVar2) {
      testing::Message::Message((Message *)&cunit3);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&local_60,(internal *)&cunit2,
                 (AssertionResult *)"precise::custom::is_custom_count_unit(cunit1.base_units())",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__6,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x456,(char *)CONCAT44(uStack_5c,local_60));
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__6,(Message *)&cunit3);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__6);
      std::__cxx11::string::~string((string *)&local_60);
      if (cunit3.multiplier_ != 0.0) {
        (**(code **)(*(long *)cunit3.multiplier_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&cunit2.base_units_);
    bVar2 = ((uint)cunit1.base_units_ & 0x73800) != 0x32800;
    cunit2.multiplier_._1_7_ = cunit2.multiplier_._1_7_;
    cunit2.multiplier_._0_1_ = bVar2;
    cunit2.base_units_ = (unit_data)0x0;
    cunit2.commodity_ = 0;
    if (!bVar2) {
      testing::Message::Message((Message *)&cunit3);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&local_60,(internal *)&cunit2,
                 (AssertionResult *)
                 "precise::custom::is_custom_count_unit_inverted( cunit1.base_units())","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__6,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x459,(char *)CONCAT44(uStack_5c,local_60));
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__6,(Message *)&cunit3);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__6);
      std::__cxx11::string::~string((string *)&local_60);
      if (cunit3.multiplier_ != 0.0) {
        (**(code **)(*(long *)cunit3.multiplier_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&cunit2.base_units_);
    if (((uint)cunit1.base_units_ & 0x180000) == 0x100000) {
      uVar3 = ((int)cunit1.base_units_ << 0x12) >> 0x1d;
      uVar1 = -uVar3;
      if (0 < (int)uVar3) {
        uVar1 = uVar3;
      }
      cunit2.multiplier_._1_7_ = cunit2.multiplier_._1_7_;
      cunit2.multiplier_._0_1_ = uVar1 < 2;
      cunit2.base_units_ = (unit_data)0x0;
      cunit2.commodity_ = 0;
      if (uVar1 >= 2) {
        testing::Message::Message((Message *)&cunit3);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&local_60,(internal *)&cunit2,
                   (AssertionResult *)"precise::custom::is_custom_unit(cunit1.base_units())","true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__6,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                   ,0x45b,(char *)CONCAT44(uStack_5c,local_60));
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__6,(Message *)&cunit3);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__6);
        std::__cxx11::string::~string((string *)&local_60);
        if (cunit3.multiplier_ != 0.0) {
          (**(code **)(*(long *)cunit3.multiplier_ + 8))();
        }
      }
    }
    else {
      cunit2.multiplier_._0_1_ = 1;
      cunit2.base_units_ = (unit_data)0x0;
      cunit2.commodity_ = 0;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&cunit2.base_units_);
    cunit2 = units::precise_unit::inv(&cunit1);
    local_60 = cunit2.base_units_;
    bVar2 = units::precise::custom::is_custom_count_unit(&local_60);
    cunit3.multiplier_._0_1_ = bVar2;
    cunit3.base_units_ = (unit_data)0x0;
    cunit3.commodity_ = 0;
    if (!bVar2) {
      testing::Message::Message((Message *)&gtest_ar__6);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&local_60,(internal *)&cunit3,
                 (AssertionResult *)"precise::custom::is_custom_count_unit(cunit2.base_units())",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x45d,(char *)CONCAT44(uStack_5c,local_60));
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&gtest_ar__6);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      std::__cxx11::string::~string((string *)&local_60);
      if ((long *)CONCAT71(gtest_ar__6._1_7_,gtest_ar__6.success_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(gtest_ar__6._1_7_,gtest_ar__6.success_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&cunit3.base_units_);
    bVar2 = ((uint)cunit2.base_units_ & 0x73800) == 0x32800;
    cunit3.multiplier_._1_7_ = cunit3.multiplier_._1_7_;
    cunit3.multiplier_._0_1_ = bVar2;
    cunit3.base_units_ = (unit_data)0x0;
    cunit3.commodity_ = 0;
    if (!bVar2) {
      testing::Message::Message((Message *)&gtest_ar__6);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&local_60,(internal *)&cunit3,
                 (AssertionResult *)
                 "precise::custom::is_custom_count_unit_inverted( cunit2.base_units())","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x460,(char *)CONCAT44(uStack_5c,local_60));
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&gtest_ar__6);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      std::__cxx11::string::~string((string *)&local_60);
      if ((long *)CONCAT71(gtest_ar__6._1_7_,gtest_ar__6.success_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(gtest_ar__6._1_7_,gtest_ar__6.success_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&cunit3.base_units_);
    if (((uint)cunit2.base_units_ & 0x180000) == 0x100000) {
      uVar3 = ((int)cunit2.base_units_ << 0x12) >> 0x1d;
      uVar1 = -uVar3;
      if (0 < (int)uVar3) {
        uVar1 = uVar3;
      }
      cunit3.multiplier_._1_7_ = cunit3.multiplier_._1_7_;
      cunit3.multiplier_._0_1_ = uVar1 < 2;
      cunit3.base_units_ = (unit_data)0x0;
      cunit3.commodity_ = 0;
      if (uVar1 >= 2) {
        testing::Message::Message((Message *)&gtest_ar__6);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&local_60,(internal *)&cunit3,
                   (AssertionResult *)"precise::custom::is_custom_unit(cunit2.base_units())","true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                   ,0x461,(char *)CONCAT44(uStack_5c,local_60));
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&gtest_ar__6);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        std::__cxx11::string::~string((string *)&local_60);
        if ((long *)CONCAT71(gtest_ar__6._1_7_,gtest_ar__6.success_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(gtest_ar__6._1_7_,gtest_ar__6.success_) + 8))();
        }
      }
    }
    else {
      cunit3.multiplier_._0_1_ = 1;
      cunit3.base_units_ = (unit_data)0x0;
      cunit3.commodity_ = 0;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&cunit3.base_units_);
    cunit3 = units::precise_unit::inv(&cunit2);
    local_60 = cunit3.base_units_;
    gtest_ar__6.success_ = units::precise::custom::is_custom_count_unit(&local_60);
    gtest_ar__6.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (!gtest_ar__6.success_) {
      testing::Message::Message((Message *)&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&local_60,(internal *)&gtest_ar__6,
                 (AssertionResult *)"precise::custom::is_custom_count_unit(cunit3.base_units())",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x463,(char *)CONCAT44(uStack_5c,local_60));
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      std::__cxx11::string::~string((string *)&local_60);
      if (local_a0.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_a0.data_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__6.message_);
    gtest_ar__6.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__6.success_ = ((uint)cunit3.base_units_ & 0x73800) != 0x32800;
    if (!gtest_ar__6.success_) {
      testing::Message::Message((Message *)&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&local_60,(internal *)&gtest_ar__6,
                 (AssertionResult *)
                 "precise::custom::is_custom_count_unit_inverted( cunit3.base_units())","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x466,(char *)CONCAT44(uStack_5c,local_60));
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      std::__cxx11::string::~string((string *)&local_60);
      if (local_a0.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_a0.data_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__6.message_);
    bVar2 = units::precise_unit::operator==(&cunit1,&cunit2);
    gtest_ar__6.success_ = !bVar2;
    gtest_ar__6.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (!gtest_ar__6.success_) {
      testing::Message::Message((Message *)&local_a0);
      std::operator<<((ostream *)&(local_a0.data_)->line,"Error with false comparison 1 index ");
      std::ostream::operator<<(&(local_a0.data_)->line,code);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&local_60,(internal *)&gtest_ar__6,(AssertionResult *)"cunit1 == cunit2",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x468,(char *)CONCAT44(uStack_5c,local_60));
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      std::__cxx11::string::~string((string *)&local_60);
      if (local_a0.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_a0.data_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__6.message_);
    bVar2 = units::precise_unit::operator==(&cunit2,&cunit3);
    gtest_ar__6.success_ = !bVar2;
    gtest_ar__6.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (!gtest_ar__6.success_) {
      testing::Message::Message((Message *)&local_a0);
      std::operator<<((ostream *)&(local_a0.data_)->line,"Error with false comparison 2 index ");
      std::ostream::operator<<(&(local_a0.data_)->line,code);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&local_60,(internal *)&gtest_ar__6,(AssertionResult *)"cunit2 == cunit3",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x46a,(char *)CONCAT44(uStack_5c,local_60));
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      std::__cxx11::string::~string((string *)&local_60);
      if (local_a0.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_a0.data_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__6.message_);
    gtest_ar__6.success_ = units::precise_unit::operator==(&cunit1,&cunit3);
    gtest_ar__6.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (!gtest_ar__6.success_) {
      testing::Message::Message((Message *)&local_a0);
      std::operator<<((ostream *)&(local_a0.data_)->line,"Error with inversion ");
      std::ostream::operator<<(&(local_a0.data_)->line,code);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&local_60,(internal *)&gtest_ar__6,(AssertionResult *)"cunit1 == cunit3",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x46c,(char *)CONCAT44(uStack_5c,local_60));
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      std::__cxx11::string::~string((string *)&local_60);
      if (local_a0.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_a0.data_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__6.message_);
    local_60 = cunit1.base_units_;
    gtest_ar__6.success_ = units::precise::custom::is_custom_count_unit(&local_60);
    gtest_ar__6.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (!gtest_ar__6.success_) {
      testing::Message::Message((Message *)&local_a0);
      std::operator<<((ostream *)&(local_a0.data_)->line,"Error with custom unit detection ");
      std::ostream::operator<<(&(local_a0.data_)->line,code);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&local_60,(internal *)&gtest_ar__6,
                 (AssertionResult *)"precise::custom::is_custom_count_unit(cunit1.base_units())",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x46d,(char *)CONCAT44(uStack_5c,local_60));
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      std::__cxx11::string::~string((string *)&local_60);
      if (local_a0.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_a0.data_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__6.message_);
    local_60 = cunit2.base_units_;
    gtest_ar__6.success_ = units::precise::custom::is_custom_count_unit(&local_60);
    gtest_ar__6.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (!gtest_ar__6.success_) {
      testing::Message::Message((Message *)&local_a0);
      std::operator<<((ostream *)&(local_a0.data_)->line,
                      "Error with custom unit detection of inverse ");
      std::ostream::operator<<(&(local_a0.data_)->line,code);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&local_60,(internal *)&gtest_ar__6,
                 (AssertionResult *)"precise::custom::is_custom_count_unit(cunit2.base_units())",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x46f,(char *)CONCAT44(uStack_5c,local_60));
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      std::__cxx11::string::~string((string *)&local_60);
      if (local_a0.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_a0.data_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__6.message_);
    local_60 = cunit3.base_units_;
    gtest_ar__6.success_ = units::precise::custom::is_custom_count_unit(&local_60);
    gtest_ar__6.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (!gtest_ar__6.success_) {
      testing::Message::Message((Message *)&local_a0);
      std::operator<<((ostream *)&(local_a0.data_)->line,"Error with custom unit detection inv inv")
      ;
      std::ostream::operator<<(&(local_a0.data_)->line,code);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&local_60,(internal *)&gtest_ar__6,
                 (AssertionResult *)"precise::custom::is_custom_count_unit(cunit3.base_units())",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x471,(char *)CONCAT44(uStack_5c,local_60));
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      std::__cxx11::string::~string((string *)&local_60);
      if (local_a0.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_a0.data_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__6.message_);
  }
  return;
}

Assistant:

TEST(customCountUnits, testAllInv)
{
    for (std::uint16_t ii = 0; ii < 16; ++ii) {
        auto cunit1 = precise::generate_custom_count_unit(ii);
        EXPECT_TRUE(precise::custom::is_custom_count_unit(cunit1.base_units()));
        EXPECT_FALSE(
            precise::custom::is_custom_count_unit_inverted(
                cunit1.base_units()));

        EXPECT_FALSE(precise::custom::is_custom_unit(cunit1.base_units()));
        auto cunit2 = cunit1.inv();
        EXPECT_TRUE(precise::custom::is_custom_count_unit(cunit2.base_units()));
        EXPECT_TRUE(
            precise::custom::is_custom_count_unit_inverted(
                cunit2.base_units()));
        EXPECT_FALSE(precise::custom::is_custom_unit(cunit2.base_units()));
        auto cunit3 = cunit2.inv();
        EXPECT_TRUE(precise::custom::is_custom_count_unit(cunit3.base_units()));
        EXPECT_FALSE(
            precise::custom::is_custom_count_unit_inverted(
                cunit3.base_units()));

        EXPECT_FALSE(cunit1 == cunit2)
            << "Error with false comparison 1 index " << ii;
        EXPECT_FALSE(cunit2 == cunit3)
            << "Error with false comparison 2 index " << ii;
        EXPECT_TRUE(cunit1 == cunit3) << "Error with inversion " << ii;
        EXPECT_TRUE(precise::custom::is_custom_count_unit(cunit1.base_units()))
            << "Error with custom unit detection " << ii;
        EXPECT_TRUE(precise::custom::is_custom_count_unit(cunit2.base_units()))
            << "Error with custom unit detection of inverse " << ii;
        EXPECT_TRUE(precise::custom::is_custom_count_unit(cunit3.base_units()))
            << "Error with custom unit detection inv inv" << ii;
    }
}